

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.cpp
# Opt level: O3

void __thiscall CVmObjTads::save_to_file(CVmObjTads *this,CVmFile *fp)

{
  char *pcVar1;
  uint16_t tmp_1;
  char *pcVar2;
  uint16_t tmp;
  short sVar3;
  ulong uVar4;
  long lVar5;
  vm_val_t *val;
  char b [2];
  undefined4 local_48;
  
  pcVar1 = (this->super_CVmObject).ext_;
  if (*(ushort *)(pcVar1 + 0x22) == 0) {
    sVar3 = 0;
  }
  else {
    lVar5 = 0;
    sVar3 = 0;
    do {
      sVar3 = sVar3 + (*(byte *)(*(long *)(pcVar1 + 0x18) + 0x10 + lVar5) & 1);
      lVar5 = lVar5 + 0x28;
    } while ((ulong)*(ushort *)(pcVar1 + 0x22) * 0x28 != lVar5);
  }
  local_48._0_2_ = sVar3;
  CVmFile::write_bytes(fp,(char *)&local_48,2);
  local_48 = CONCAT22(local_48._2_2_,*(undefined2 *)((this->super_CVmObject).ext_ + 0x24));
  CVmFile::write_bytes(fp,(char *)&local_48,2);
  pcVar2 = (this->super_CVmObject).ext_;
  if (*(short *)(pcVar2 + 0x24) != 0) {
    lVar5 = 0x28;
    uVar4 = 0;
    do {
      local_48 = *(undefined4 *)(pcVar2 + lVar5);
      CVmFile::write_bytes(fp,(char *)&local_48,4);
      uVar4 = uVar4 + 1;
      pcVar2 = (this->super_CVmObject).ext_;
      lVar5 = lVar5 + 0x10;
    } while (uVar4 < *(ushort *)(pcVar2 + 0x24));
  }
  uVar4 = (ulong)*(ushort *)(pcVar1 + 0x22);
  if (uVar4 != 0) {
    val = (vm_val_t *)(*(long *)(pcVar1 + 0x18) + 0x18);
    do {
      if (((ulong)val[-1].val & 1) != 0) {
        local_48 = CONCAT22(local_48._2_2_,val[-2].val.prop);
        vmb_put_dh((char *)((long)&local_48 + 2),val);
        CVmFile::write_bytes(fp,(char *)&local_48,7);
      }
      val = (vm_val_t *)&val[2].val;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  return;
}

Assistant:

void CVmObjTads::save_to_file(VMG_ CVmFile *fp)
{
    size_t i;
    vm_tadsobj_prop *entry;
    uint cnt;
    vm_tadsobj_hdr *hdr = get_hdr();

    /* count the number of properties that have actually been modified */
    for (cnt = 0, i = hdr->prop_entry_free, entry = hdr->prop_entry_arr ;
         i != 0 ; --i, ++entry)
    {
        /* if the slot is modified, count it */
        if ((entry->flags & VMTO_PROP_MOD) != 0)
            ++cnt;
    }

    /* write the number of modified properties */
    fp->write_uint2(cnt);

    /* write the number of superclasses */
    fp->write_uint2(get_sc_count());

    /* write the superclasses */
    for (i = 0 ; i < get_sc_count() ; ++i)
        fp->write_uint4(get_sc(i));

    /* write each modified property */
    for (cnt = 0, i = hdr->prop_entry_free, entry = hdr->prop_entry_arr ;
         i != 0 ; --i, ++entry)
    {
        /* if the slot is modified, write it out */
        if ((entry->flags & VMTO_PROP_MOD) != 0)
        {
            char slot[16];

            /* prepare the slot data */
            oswp2(slot, entry->prop);
            vmb_put_dh(slot + 2, &entry->val);

            /* write the slot */
            fp->write_bytes(slot, 2 + VMB_DATAHOLDER);
        }
    }
}